

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurImage.cpp
# Opt level: O2

void blurImage(EnvmapImage *image1,bool verbose)

{
  Rgba *pRVar1;
  Envmap EVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  Box2i *pBVar8;
  Array2D<Imf_3_2::Rgba> *pAVar9;
  Array2D<Imf_3_2::Rgba> *pAVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  Rgba *pRVar17;
  undefined7 in_register_00000031;
  int f1;
  uint uVar18;
  int x1;
  int iVar19;
  EnvmapImage *this;
  EnvmapImage *this_00;
  bool bVar20;
  bool bVar21;
  float fVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  Vec3<float> VVar26;
  V3f dir;
  int iStack_15c;
  double local_150;
  Box2i dw;
  EnvmapImage *local_108;
  V2f posInFace;
  float local_f8;
  V2f pos;
  float local_dc;
  V2f posInFace1;
  V2f posInFace2;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  V2f pos1;
  V2f pos2;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  EnvmapImage image2;
  
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"blurring map image");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  this = &image2;
  EnvmapImage::EnvmapImage(this);
  pBVar8 = EnvmapImage::dataWindow(image1);
  iVar13 = (pBVar8->max).x;
  pBVar8 = EnvmapImage::dataWindow(image1);
  iVar3 = (pBVar8->min).x;
  EVar2 = EnvmapImage::type(image1);
  uVar16 = (iVar13 - iVar3) + 1;
  local_108 = image1;
  if (EVar2 == ENVMAP_LATLONG) {
    if (verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"    converting to cube-face format");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    uVar16 = (int)uVar16 / 4;
    dw.min.x = 0;
    dw.min.y = 0;
    dw.max.y = uVar16 * 6 + -1;
    dw.max.x = uVar16 - 1;
    local_108 = &image2;
    resizeCube(image1,local_108,&dw,1.0,7);
    this = image1;
  }
  while (this_00 = this, 0x28 < (int)uVar16) {
    bVar20 = uVar16 < 0x50;
    uVar16 = uVar16 >> 1;
    if (bVar20) {
      uVar16 = 0x28;
    }
    if (verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"    resizing cube faces to ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar16);
      poVar7 = std::operator<<(poVar7," by ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar16);
      poVar7 = std::operator<<(poVar7," pixels");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    dw.min.x = 0;
    dw.min.y = 0;
    dw.max.y = uVar16 * 6 + -1;
    dw.max.x = uVar16 - 1;
    resizeCube(local_108,this_00,&dw,1.0,7);
    this = local_108;
    local_108 = this_00;
  }
  if (verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"    computing pixel weights");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pBVar8 = EnvmapImage::dataWindow(local_108);
  dw.min = pBVar8->min;
  dw.max = pBVar8->max;
  iVar3 = Imf_3_2::CubeMap::sizeOfFace((Box *)&dw);
  pAVar9 = EnvmapImage::pixels(local_108);
  uVar16 = 0;
  iVar13 = 0;
  if (0 < iVar3) {
    iVar13 = iVar3;
  }
  local_150 = 0.0;
  for (; uVar16 != 6; uVar16 = uVar16 + 1) {
    if (verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"        face ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar16);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    for (iVar4 = 0; iVar4 != iVar13; iVar4 = iVar4 + 1) {
      bVar20 = iVar4 != iVar3 + -1;
      for (iVar12 = 0; iVar12 != iVar3; iVar12 = iVar12 + 1) {
        posInFace.x = (float)iVar12;
        bVar21 = iVar12 - iVar3 != -1;
        posInFace.y = (float)iVar4;
        Imf_3_2::CubeMap::direction((CubeMapFace)&pos,(Box *)(ulong)uVar16,(Vec2 *)&dw);
        VVar26 = Imath_3_2::Vec3<float>::normalized(&dir);
        uStack_68 = CONCAT44(posInFace.y,posInFace.x);
        Imf_3_2::CubeMap::pixelPosition(uStack_68,VVar26.z,&pos,uVar16,&dw,&uStack_68);
        dVar25 = ((double)(dir.z / dir.x) * (double)(dir.z / dir.x) +
                  (double)(dir.y / dir.x) * (double)(dir.y / dir.x) + 1.0) *
                 (double)(dir.z * 0.0 + dir.x * 1.0 + dir.y * 0.0);
        if (iVar12 != 0 && bVar21 || bVar20 && iVar4 != 0) {
          if ((iVar12 == 0 || !bVar21) || (!bVar20 || iVar4 == 0)) {
            dVar25 = dVar25 * 0.5;
          }
        }
        else {
          dVar25 = dVar25 / 3.0;
        }
        lVar15 = (long)(int)(pos.y + 0.5) * pAVar9->_sizeY;
        pRVar1 = pAVar9->_data;
        lVar11 = (long)(int)(pos.x + 0.5);
        fVar22 = (float)dVar25;
        Imath_3_2::half::operator*=(&pRVar1[lVar15 + lVar11].r,fVar22);
        Imath_3_2::half::operator*=(&pRVar1[lVar15 + lVar11].g,fVar22);
        Imath_3_2::half::operator*=(&pRVar1[lVar15 + lVar11].b,fVar22);
        Imath_3_2::half::operator*=(&pRVar1[lVar15 + lVar11].a,fVar22);
        local_150 = local_150 + dVar25;
      }
    }
  }
  iVar13 = ((dw.max.y - dw.min.y) + 1) * ((dw.max.x - dw.min.x) + 1);
  auVar24._8_4_ = iVar13 >> 0x1f;
  auVar24._0_8_ = (long)iVar13;
  auVar24._12_4_ = 0x45300000;
  pRVar17 = pAVar9->_data;
  pRVar1 = pRVar17 + iVar13;
  fVar22 = (float)(((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) / local_150);
  for (; pRVar17 < pRVar1; pRVar17 = pRVar17 + 1) {
    Imath_3_2::half::operator*=(&pRVar17->r,fVar22);
    Imath_3_2::half::operator*=(&pRVar17->g,fVar22);
    Imath_3_2::half::operator*=(&pRVar17->b,fVar22);
    Imath_3_2::half::operator*=(&pRVar17->a,fVar22);
  }
  if (verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"    generating blurred image");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pBVar8 = EnvmapImage::dataWindow(local_108);
  dw.min = pBVar8->min;
  dw.max = pBVar8->max;
  iVar3 = Imf_3_2::CubeMap::sizeOfFace((Box *)&dw);
  dir.x = 0.0;
  dir.y = 0.0;
  dir.z = 1.38729e-43;
  iStack_15c = 599;
  iVar4 = Imf_3_2::CubeMap::sizeOfFace((Box *)&dir);
  EnvmapImage::resize(this_00,ENVMAP_CUBE,(Box2i *)&dir);
  EnvmapImage::clear(this_00);
  pAVar9 = EnvmapImage::pixels(local_108);
  pAVar10 = EnvmapImage::pixels(this_00);
  uVar16 = 0;
  iVar13 = 0;
  if (0 < iVar3) {
    iVar13 = iVar3;
  }
  iVar12 = 0;
  if (0 < iVar4) {
    iVar12 = iVar4;
  }
  for (; uVar16 != 6; uVar16 = uVar16 + 1) {
    if (verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"        face ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar16);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    for (iVar6 = 0; iVar6 != iVar12; iVar6 = iVar6 + 1) {
      for (iVar14 = 0; iVar14 != iVar4; iVar14 = iVar14 + 1) {
        Imf_3_2::CubeMap::direction((CubeMapFace)&pos,(Box *)(ulong)uVar16,(Vec2 *)&dir);
        local_70 = CONCAT44((float)iVar6,(float)iVar14);
        Imf_3_2::CubeMap::pixelPosition(&pos2,uVar16,&dir,&local_70);
        pRVar1 = pAVar10->_data +
                 (long)(int)(pos2.y + 0.5) * pAVar10->_sizeY + (long)(int)(pos2.x + 0.5);
        local_b8 = ZEXT416(0);
        local_150 = 0.0;
        local_a8._0_16_ = ZEXT816(0);
        for (uVar18 = 0; uVar18 != 6; uVar18 = uVar18 + 1) {
          for (iVar5 = 0; iVar5 != iVar13; iVar5 = iVar5 + 1) {
            for (iVar19 = 0; iVar3 != iVar19; iVar19 = iVar19 + 1) {
              Imf_3_2::CubeMap::direction((CubeMapFace)&posInFace,(Box *)(ulong)uVar18,(Vec2 *)&dw);
              local_78 = CONCAT44((float)iVar5,(float)iVar19);
              Imf_3_2::CubeMap::pixelPosition(&pos1,uVar18,&dw,&local_78);
              fVar22 = local_f8 * local_dc + posInFace.x * pos.x + posInFace.y * pos.y;
              if (0.0 < fVar22) {
                lVar11 = (long)(int)(pos1.y + 0.5) * pAVar9->_sizeY;
                pRVar17 = pAVar9->_data;
                dVar23 = (double)fVar22;
                lVar15 = (long)(int)(pos1.x + 0.5);
                local_150 = local_150 + dVar23;
                dVar25 = (double)local_b8._8_8_ +
                         (double)*(float *)(_imath_half_to_float_table +
                                           (ulong)pRVar17[lVar11 + lVar15].g._h * 4) * dVar23;
                local_b8._8_4_ = SUB84(dVar25,0);
                local_b8._0_8_ =
                     (double)local_b8._0_8_ +
                     (double)*(float *)(_imath_half_to_float_table +
                                       (ulong)pRVar17[lVar11 + lVar15].r._h * 4) * dVar23;
                local_b8._12_4_ = (int)((ulong)dVar25 >> 0x20);
                dVar25 = (double)local_a8._8_8_ +
                         dVar23 * (double)*(float *)(_imath_half_to_float_table +
                                                    (ulong)pRVar17[lVar11 + lVar15].a._h * 4);
                local_a8._8_4_ = SUB84(dVar25,0);
                local_a8._0_8_ =
                     (double)local_a8._0_8_ +
                     dVar23 * (double)*(float *)(_imath_half_to_float_table +
                                                (ulong)pRVar17[lVar11 + lVar15].b._h * 4);
                local_a8._12_4_ = (int)((ulong)dVar25 >> 0x20);
              }
            }
          }
        }
        Imath_3_2::half::operator=(&pRVar1->r,(float)((double)local_b8._0_8_ / local_150));
        Imath_3_2::half::operator=(&pRVar1->g,(float)((double)local_b8._8_8_ / local_150));
        Imath_3_2::half::operator=(&pRVar1->b,(float)((double)local_a8._0_8_ / local_150));
        Imath_3_2::half::operator=(&pRVar1->a,(float)((double)local_a8._8_8_ / local_150));
      }
    }
  }
  if (this_00 != image1) {
    if (verbose) {
      poVar7 = std::operator<<((ostream *)&std::cout,"    copying");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    pBVar8 = EnvmapImage::dataWindow(this_00);
    dw.min = pBVar8->min;
    dw.max = pBVar8->max;
    EnvmapImage::resize(image1,ENVMAP_CUBE,&dw);
    iVar13 = dw.max.x - dw.min.x;
    iVar3 = dw.max.y - dw.min.y;
    pAVar9 = EnvmapImage::pixels(image1);
    pRVar1 = pAVar9->_data;
    pAVar9 = EnvmapImage::pixels(this_00);
    memcpy(pRVar1,pAVar9->_data,(long)((iVar3 + 1) * (iVar13 + 1)) << 3);
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&image2._pixels);
  return;
}

Assistant:

void
blurImage (EnvmapImage& image1, bool verbose)
{
    //
    // Ideally we would blur the input image directly by convolving
    // it with a 180-degree wide blur kernel.  Unfortunately this
    // is prohibitively expensive when the input image is large.
    // In order to keep running times reasonable, we perform the
    // blur on a small proxy image that will later be re-sampled
    // to the desired output resolution.
    //
    // Here's how it works:
    //
    // * If the input image is in latitude-longitude format,
    //   convert it into a cube-face environment map.
    //
    // * Repeatedly resample the image, each time shrinking
    //   it to no less than half its current size, until the
    //   width of each cube face is MAX_IN_WIDTH pixels.
    //
    // * Multiply each pixel by a weight that is proportional
    //   to the solid angle subtended by the pixel as seen
    //   from the center of the environment cube.
    //
    // * Create an output image in cube-face format.
    //   The cube faces of the output image are OUT_WIDTH
    //   pixels wide.
    //
    // * For each pixel of the output image:
    //
    //       Set the output pixel's color to black
    //
    //       Determine the direction, d2, from the center of the
    //       output environment cube to the center of the output
    //	     pixel.
    //
    //       For each pixel of the input image:
    //
    //           Determine the direction, d1, from the center of
    //           the input environment cube to the center of the
    //           input pixel.
    //
    //           Multiply the input pixel's color by max (0, d1.dot(d2))
    //           and add the result to the output pixel.
    //

    const int MAX_IN_WIDTH = 40;
    const int OUT_WIDTH    = 100;

    if (verbose) cout << "blurring map image" << endl;

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    int w = image1.dataWindow ().max.x - image1.dataWindow ().min.x + 1;
    int h = w * 6;

    if (iptr1->type () == ENVMAP_LATLONG)
    {
        //
        // Convert the input image from latitude-longitude
        // to cube-face format.
        //

        if (verbose) cout << "    converting to cube-face format" << endl;

        w /= 4;
        h = w * 6;

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    while (w > MAX_IN_WIDTH)
    {
        //
        // Shrink the image.
        //

        if (w >= MAX_IN_WIDTH * 2)
            w /= 2;
        else
            w = MAX_IN_WIDTH;

        h = w * 6;

        if (verbose)
        {
            cout << "    resizing cube faces "
                    "to "
                 << w << " by " << w << " pixels" << endl;
        }

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "    computing pixel weights" << endl;

    {
        //
        // Multiply each pixel by a weight that is proportional
        // to the solid angle subtended by the pixel.
        //

        Box2i dw  = iptr1->dataWindow ();
        int   sof = CubeMap::sizeOfFace (dw);

        Array2D<Rgba>& pixels = iptr1->pixels ();

        double weightTotal = 0;

        for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
        {
            if (verbose) cout << "        face " << f << endl;

            CubeMapFace face = CubeMapFace (f);
            V3f         faceDir (0, 0, 0);
            int         ix = 0, iy = 0, iz = 0;

            switch (face)
            {
                case CUBEFACE_POS_X:
                    faceDir = V3f (1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_X:
                    faceDir = V3f (-1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Y:
                    faceDir = V3f (0, 1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_Y:
                    faceDir = V3f (0, -1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Z:
                    faceDir = V3f (0, 0, 1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;

                case CUBEFACE_NEG_Z:
                    faceDir = V3f (0, 0, -1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;
            }

            for (int y = 0; y < sof; ++y)
            {
                bool yEdge = (y == 0 || y == sof - 1);

                for (int x = 0; x < sof; ++x)
                {
                    bool xEdge = (x == 0 || x == sof - 1);

                    V2f posInFace (x, y);

                    V3f dir =
                        CubeMap::direction (face, dw, posInFace).normalized ();

                    V2f pos = CubeMap::pixelPosition (face, dw, posInFace);

                    //
                    // The solid angle subtended by pixel (x,y), as seen
                    // from the center of the cube, is proportional to the
                    // square of the distance of the pixel from the center
                    // of the cube and proportional to the dot product of
                    // the viewing direction and the normal of the cube
                    // face that contains the pixel.
                    //

                    double weight =
                        (dir ^ faceDir) *
                        (sqr (dir[iy] / dir[ix]) + sqr (dir[iz] / dir[ix]) + 1);

                    //
                    // Pixels at the edges and corners of the
                    // cube are duplicated; we must adjust the
                    // pixel weights accordingly.
                    //

                    if (xEdge && yEdge)
                        weight /= 3;
                    else if (xEdge || yEdge)
                        weight /= 2;

                    Rgba& pixel = pixels[toInt (pos.y)][toInt (pos.x)];

                    pixel.r *= weight;
                    pixel.g *= weight;
                    pixel.b *= weight;
                    pixel.a *= weight;

                    weightTotal += weight;
                }
            }
        }

        //
        // The weighting operation above has made the overall image darker.
        // Apply a correction to recover the image's original brightness.
        //

        int    w         = dw.max.x - dw.min.x + 1;
        int    h         = dw.max.y - dw.min.y + 1;
        size_t numPixels = w * h;
        double weight    = numPixels / weightTotal;

        Rgba* p   = &pixels[0][0];
        Rgba* end = p + numPixels;

        while (p < end)
        {
            p->r *= weight;
            p->g *= weight;
            p->b *= weight;
            p->a *= weight;

            ++p;
        }
    }

    {
        if (verbose) cout << "    generating blurred image" << endl;

        Box2i dw1  = iptr1->dataWindow ();
        int   sof1 = CubeMap::sizeOfFace (dw1);

        Box2i dw2 (V2i (0, 0), V2i (OUT_WIDTH - 1, OUT_WIDTH * 6 - 1));
        int   sof2 = CubeMap::sizeOfFace (dw2);

        iptr2->resize (ENVMAP_CUBE, dw2);
        iptr2->clear ();

        Array2D<Rgba>& pixels1 = iptr1->pixels ();
        Array2D<Rgba>& pixels2 = iptr2->pixels ();

        for (int f2 = CUBEFACE_POS_X; f2 <= CUBEFACE_NEG_Z; ++f2)
        {
            if (verbose) cout << "        face " << f2 << endl;

            CubeMapFace face2 = CubeMapFace (f2);

            for (int y2 = 0; y2 < sof2; ++y2)
            {
                for (int x2 = 0; x2 < sof2; ++x2)
                {
                    V2f posInFace2 (x2, y2);

                    V3f dir2 = CubeMap::direction (face2, dw2, posInFace2);

                    V2f pos2 = CubeMap::pixelPosition (face2, dw2, posInFace2);

                    double weightTotal = 0;
                    double rTotal      = 0;
                    double gTotal      = 0;
                    double bTotal      = 0;
                    double aTotal      = 0;

                    Rgba& pixel2 = pixels2[toInt (pos2.y)][toInt (pos2.x)];

                    for (int f1 = CUBEFACE_POS_X; f1 <= CUBEFACE_NEG_Z; ++f1)
                    {
                        CubeMapFace face1 = CubeMapFace (f1);

                        for (int y1 = 0; y1 < sof1; ++y1)
                        {
                            for (int x1 = 0; x1 < sof1; ++x1)
                            {
                                V2f posInFace1 (x1, y1);

                                V3f dir1 =
                                    CubeMap::direction (face1, dw1, posInFace1);

                                V2f pos1 = CubeMap::pixelPosition (
                                    face1, dw1, posInFace1);

                                double weight = dir1 ^ dir2;

                                if (weight <= 0) continue;

                                Rgba& pixel1 =
                                    pixels1[toInt (pos1.y)][toInt (pos1.x)];

                                weightTotal += weight;
                                rTotal += pixel1.r * weight;
                                gTotal += pixel1.g * weight;
                                bTotal += pixel1.b * weight;
                                aTotal += pixel1.a * weight;
                            }
                        }
                    }

                    pixel2.r = rTotal / weightTotal;
                    pixel2.g = gTotal / weightTotal;
                    pixel2.b = bTotal / weightTotal;
                    pixel2.a = aTotal / weightTotal;
                }
            }
        }

        swap (iptr1, iptr2);
    }

    //
    // Depending on how many times we've re-sampled the image,
    // the result is now either in image1 or in image2.
    // If necessary, copy the result into image1.
    //

    if (iptr1 != &image1)
    {
        if (verbose) cout << "    copying" << endl;

        Box2i dw = iptr1->dataWindow ();
        image1.resize (ENVMAP_CUBE, dw);

        int    w    = dw.max.x - dw.min.x + 1;
        int    h    = dw.max.y - dw.min.y + 1;
        size_t size = w * h * sizeof (Rgba);

        memcpy (&image1.pixels ()[0][0], &iptr1->pixels ()[0][0], size);
    }
}